

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::Decompose_Cholesky
          (TPZMatrix<Fad<double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  char cVar2;
  value_type vVar3;
  double dVar4;
  undefined4 uVar5;
  list<long,_std::allocator<long>_> *plVar6;
  int iVar7;
  int extraout_var;
  _List_node_base *p_Var8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  int i;
  uint uVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  int i_1;
  _List_node_base *p_Var15;
  ulong uVar16;
  double dVar17;
  Fad<double> tmp2;
  Fad<double> tmp;
  int sz;
  undefined1 local_148 [16];
  EVP_PKEY_CTX *local_138;
  double *pdStack_130;
  double local_128;
  _List_node_base *local_120;
  Fad<double> local_118;
  Fad<double> local_f8;
  Fad<double> local_d8;
  double local_b8;
  undefined8 uStack_b0;
  _List_node_base *local_a0;
  undefined1 local_98 [16];
  double *local_88;
  double local_80;
  FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> local_78;
  list<long,_std::allocator<long>_> *local_68;
  Fad<double> local_60;
  Fad<double> *local_40;
  undefined1 *local_38;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  local_68 = singular;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_a0 = (_List_node_base *)CONCAT44(extraout_var,iVar7);
    if (local_a0 != (_List_node_base *)0x0 && -1 < extraout_var) {
      p_Var15 = (_List_node_base *)0x0;
      do {
        local_120 = p_Var15;
        if (p_Var15 != (_List_node_base *)0x0) {
          p_Var8 = (_List_node_base *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_118,this,p_Var15,p_Var15);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_d8,this,p_Var15,p_Var8);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_f8,this,p_Var15,p_Var8);
            local_78.left_ = &local_d8;
            local_148._0_8_ = local_118.val_ - local_d8.val_ * local_f8.val_;
            uVar12 = local_f8.dx_.num_elts;
            if (local_f8.dx_.num_elts < local_d8.dx_.num_elts) {
              uVar12 = local_d8.dx_.num_elts;
            }
            if ((int)uVar12 < local_118.dx_.num_elts) {
              uVar12 = local_118.dx_.num_elts;
            }
            local_148._8_4_ = 0;
            local_138 = (EVP_PKEY_CTX *)0x0;
            local_98._0_8_ = &local_118;
            local_98._8_8_ = &local_78;
            local_78.right_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_f8;
            if ((int)uVar12 < 1) {
              pdStack_130 = (double *)0x0;
            }
            else {
              local_148._8_4_ = uVar12;
              local_138 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar12 * 8);
              pdStack_130 = (double *)0x0;
              if (0 < (int)uVar12) {
                uVar13 = 0;
                do {
                  vVar3 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                          ::dx((FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                                *)local_98,(int)uVar13);
                  *(value_type *)(local_138 + uVar13 * 8) = vVar3;
                  uVar13 = uVar13 + 1;
                } while (uVar12 != uVar13);
              }
            }
            p_Var15 = local_120;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,local_120,local_120,local_148);
            Fad<double>::~Fad((Fad<double> *)local_148);
            Fad<double>::~Fad(&local_f8);
            Fad<double>::~Fad(&local_d8);
            Fad<double>::~Fad(&local_118);
            p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
          } while (p_Var8 != p_Var15);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_148,this,p_Var15,p_Var15);
        local_b8 = ABS((double)local_148._0_8_);
        uStack_b0 = 0;
        local_118.val_ = 1e-12;
        local_118.dx_.num_elts = 0;
        local_118.dx_.ptr_to_data = (double *)0x0;
        local_118.defaultVal = 0.0;
        Fad<double>::~Fad(&local_118);
        Fad<double>::~Fad((Fad<double> *)local_148);
        if (local_b8 <= 1e-12) {
          p_Var8 = (_List_node_base *)operator_new(0x18);
          plVar6 = local_68;
          p_Var8[1]._M_next = p_Var15;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          p_Var15 = local_120;
          psVar1 = &(plVar6->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_148._0_8_ = 1.0;
          local_148._8_4_ = 0;
          local_138 = (EVP_PKEY_CTX *)0x0;
          pdStack_130 = (double *)0x0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,local_120,local_120,local_148);
          Fad<double>::~Fad((Fad<double> *)local_148);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_f8,this,p_Var15,p_Var15);
        FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)&local_118,&local_f8);
        FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_148,
                   (FadFuncSqrt<Fad<double>_> *)&local_118);
        Fad<double>::~Fad(&local_118);
        dVar4 = (double)CONCAT44(local_148._12_4_,local_148._8_4_);
        if (dVar4 < 0.0) {
          local_d8.val_ = sqrt(dVar4);
        }
        else {
          local_d8.val_ = SQRT(dVar4);
        }
        uVar12 = (uint)local_138;
        local_d8.dx_.num_elts = 0;
        local_d8.dx_.ptr_to_data = (double *)0x0;
        if ((long)(int)(uint)local_138 < 1) {
          local_d8.defaultVal = 0.0;
        }
        else {
          local_d8.dx_.num_elts = (uint)local_138;
          uVar13 = (long)(int)(uint)local_138 << 3;
          local_d8.dx_.ptr_to_data = (double *)operator_new__(uVar13);
          local_d8.defaultVal = 0.0;
          if (0 < (int)uVar12) {
            uVar16 = 0;
            do {
              pdVar9 = (double *)((long)pdStack_130 + uVar16);
              if ((uint)local_138 == 0) {
                pdVar9 = &local_128;
              }
              dVar4 = (double)CONCAT44(local_148._12_4_,local_148._8_4_);
              if (dVar4 < 0.0) {
                local_b8 = *pdVar9;
                dVar4 = sqrt(dVar4);
                dVar17 = local_b8;
              }
              else {
                dVar4 = SQRT(dVar4);
                dVar17 = *pdVar9;
              }
              *(double *)((long)local_d8.dx_.ptr_to_data + uVar16) = dVar17 / (dVar4 + dVar4);
              uVar16 = uVar16 + 8;
            } while (uVar13 != uVar16);
          }
        }
        Fad<double>::~Fad((Fad<double> *)(local_148 + 8));
        Fad<double>::~Fad(&local_f8);
        p_Var15 = local_120;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_120,local_120,&local_d8);
        while (p_Var15 = (_List_node_base *)((long)&p_Var15->_M_next + 1),
              (long)p_Var15 < (long)local_a0) {
          p_Var8 = local_120;
          if (local_120 != (_List_node_base *)0x0) {
            p_Var14 = (_List_node_base *)0x0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_118,this,p_Var8,p_Var15);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_f8,this,p_Var8,p_Var14);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_98,this,p_Var14,p_Var15);
              local_40 = &local_f8;
              local_78.left_ = &local_118;
              local_78.right_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_40;
              local_148._0_8_ = local_118.val_ - local_f8.val_ * (double)local_98._0_8_;
              uVar12 = local_98._8_4_;
              if ((int)local_98._8_4_ < local_f8.dx_.num_elts) {
                uVar12 = local_f8.dx_.num_elts;
              }
              if ((int)uVar12 < local_118.dx_.num_elts) {
                uVar12 = local_118.dx_.num_elts;
              }
              local_148._8_4_ = 0;
              local_138 = (EVP_PKEY_CTX *)0x0;
              local_38 = local_98;
              if ((int)uVar12 < 1) {
                pdStack_130 = (double *)0x0;
              }
              else {
                local_148._8_4_ = uVar12;
                local_138 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar12 * 8);
                pdStack_130 = (double *)0x0;
                if (0 < (int)uVar12) {
                  uVar13 = 0;
                  do {
                    vVar3 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                            ::dx(&local_78,(int)uVar13);
                    *(value_type *)(local_138 + uVar13 * 8) = vVar3;
                    uVar13 = uVar13 + 1;
                  } while (uVar12 != uVar13);
                }
              }
              p_Var8 = local_120;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,local_120,p_Var15,local_148);
              Fad<double>::~Fad((Fad<double> *)local_148);
              Fad<double>::~Fad((Fad<double> *)local_98);
              Fad<double>::~Fad(&local_f8);
              Fad<double>::~Fad(&local_118);
              p_Var14 = (_List_node_base *)((long)&p_Var14->_M_next + 1);
            } while (p_Var14 != p_Var8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_148,this,p_Var8,p_Var8);
          uVar5 = local_148._8_4_;
          local_60.val_ = (double)local_148._0_8_;
          local_60.dx_.num_elts = local_148._8_4_;
          local_60.dx_.ptr_to_data = (double *)0x0;
          if ((long)(int)local_148._8_4_ != 0) {
            uVar13 = (long)(int)local_148._8_4_ * 8;
            if ((int)local_148._8_4_ < 0) {
              uVar13 = 0xffffffffffffffff;
            }
            local_60.dx_.ptr_to_data = (double *)operator_new__(uVar13);
            MEM_CPY<double>::copy
                      ((MEM_CPY<double> *)local_60.dx_.ptr_to_data,local_138,
                       (EVP_PKEY_CTX *)(ulong)(uint)uVar5);
          }
          local_60.defaultVal = (double)pdStack_130;
          local_b8 = ABS(local_60.val_);
          uStack_b0 = 0;
          Fad<double>::~Fad(&local_60);
          if (local_b8 < 1e-12) {
            Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
          }
          p_Var8 = local_120;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_f8,this,local_120,p_Var15);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_98,this,p_Var8);
          iVar7 = local_f8.dx_.num_elts;
          local_118.val_ = local_f8.val_ / (double)local_98._0_8_;
          uVar5 = local_98._8_4_;
          uVar12 = local_98._8_4_;
          if ((int)local_98._8_4_ < local_f8.dx_.num_elts) {
            uVar12 = local_f8.dx_.num_elts;
          }
          local_118.dx_.num_elts = 0;
          local_118.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar12) {
            local_b8 = (double)CONCAT44(local_b8._4_4_,uVar12);
            uVar13 = (ulong)uVar12;
            local_118.dx_.num_elts = uVar12;
            local_118.dx_.ptr_to_data = (double *)operator_new__(uVar13 * 8);
            local_118.defaultVal = 0.0;
            if (0 < local_b8._0_4_) {
              lVar10 = 0;
              do {
                pdVar9 = (double *)((long)local_f8.dx_.ptr_to_data + lVar10);
                if (iVar7 == 0) {
                  pdVar9 = &local_f8.defaultVal;
                }
                pdVar11 = (double *)((long)local_88 + lVar10);
                if (uVar5 == 0) {
                  pdVar11 = &local_80;
                }
                *(double *)((long)local_118.dx_.ptr_to_data + lVar10) =
                     (*pdVar9 * (double)local_98._0_8_ - local_f8.val_ * *pdVar11) /
                     ((double)local_98._0_8_ * (double)local_98._0_8_);
                lVar10 = lVar10 + 8;
                uVar13 = uVar13 - 1;
              } while (uVar13 != 0);
            }
          }
          p_Var8 = local_120;
          local_118.defaultVal = 0.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,local_120,p_Var15,&local_118);
          Fad<double>::~Fad(&local_118);
          Fad<double>::~Fad((Fad<double> *)local_98);
          Fad<double>::~Fad(&local_f8);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_118,this,p_Var8,p_Var15);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var15,p_Var8,&local_118);
          Fad<double>::~Fad(&local_118);
          Fad<double>::~Fad((Fad<double> *)local_148);
        }
        Fad<double>::~Fad(&local_d8);
        p_Var15 = (_List_node_base *)((long)&local_120->_M_next + 1);
      } while (p_Var15 != local_a0);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}